

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_client.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  allocator<unsigned_long> *this;
  char *pcVar1;
  int iVar2;
  __int_type _Var3;
  size_type __n;
  element_type *peVar4;
  anon_class_8_1_67a2a80d local_338;
  BoolFunctor local_330;
  anon_class_40_5_43149672 local_310;
  function<void_()> local_2e8;
  anon_class_16_1_df24ad85 local_2c8;
  BasicHandler local_2b8;
  Timestamp local_298;
  anon_class_72_9_f2cf4f9e local_288;
  Connector local_240;
  reference local_220;
  unsigned_long *pBytes;
  BasicHandler local_208;
  Timestamp local_1e8;
  allocator local_1d1;
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8;
  undefined1 local_188 [8];
  shared_ptr<Liby::TcpClient> echo_client;
  int i;
  Timestamp start;
  string local_158;
  undefined1 local_138 [8];
  EventLoopGroup group;
  vector<Liby::Connection_*,_std::allocator<Liby::Connection_*>_> conns;
  value_type_conflict1 local_88;
  undefined1 local_80 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> bytes;
  allocator_type local_52;
  value_type local_51;
  undefined1 local_50 [8];
  vector<char,_std::allocator<char>_> buf;
  unsigned_long bytesPerClients;
  atomic_int finished_clients;
  atomic_int connected_clients;
  atomic_int active_clients;
  int concurrency;
  int msg_len;
  int msg_num;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  _msg_len = argv;
  argv_local._0_4_ = argc;
  memset((void *)((long)&bytesPerClients + 4),0,4);
  memset(&bytesPerClients,0,4);
  if ((int)argv_local == 7) {
    concurrency = atoi(_msg_len[5]);
    active_clients.super___atomic_base<int>._M_i = (__atomic_base<int>)atoi(_msg_len[6]);
    connected_clients.super___atomic_base<int>._M_i = (__atomic_base<int>)atoi(_msg_len[3]);
    iVar2 = atoi(_msg_len[4]);
    std::__atomic_base<int>::operator=(&finished_clients.super___atomic_base<int>,iVar2);
  }
  else {
    if ((int)argv_local != 6) {
      print_usage();
      return 1;
    }
    concurrency = atoi(_msg_len[4]);
    active_clients.super___atomic_base<int>._M_i = (__atomic_base<int>)atoi(_msg_len[5]);
    connected_clients.super___atomic_base<int>._M_i = (__atomic_base<int>)atoi(_msg_len[3]);
    std::__atomic_base<int>::operator=
              (&finished_clients.super___atomic_base<int>,
               (__int_type)connected_clients.super___atomic_base<int>._M_i);
  }
  buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ =
       SEXT48((int)active_clients.super___atomic_base<int>._M_i * concurrency);
  local_51 = 'A';
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_50,
             (long)(int)active_clients.super___atomic_base<int>._M_i,&local_51,&local_52);
  std::allocator<char>::~allocator(&local_52);
  __n = (size_type)(int)connected_clients.super___atomic_base<int>._M_i;
  local_88 = 0;
  this = (allocator<unsigned_long> *)
         ((long)&conns.super__Vector_base<Liby::Connection_*,_std::allocator<Liby::Connection_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_long>::allocator(this);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_80,__n,&local_88,this);
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)
             ((long)&conns.
                     super__Vector_base<Liby::Connection_*,_std::allocator<Liby::Connection_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<Liby::Connection_*,_std::allocator<Liby::Connection_*>_>::vector
            ((vector<Liby::Connection_*,_std::allocator<Liby::Connection_*>_> *)
             &group.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_158,"EPOLL",(allocator *)((long)&start.tv_.tv_usec + 7));
  Liby::EventLoopGroup::EventLoopGroup((EventLoopGroup *)local_138,4,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)((long)&start.tv_.tv_usec + 7));
  Liby::Timestamp::now();
  for (echo_client.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       ._4_4_ = 0;
      echo_client.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _4_4_ < (int)connected_clients.super___atomic_base<int>._M_i;
      echo_client.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _4_4_ = echo_client.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi._4_4_ + 1) {
    pcVar1 = _msg_len[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1a8,pcVar1,&local_1a9);
    pcVar1 = _msg_len[2];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d0,pcVar1,&local_1d1);
    Liby::EventLoopGroup::creatTcpClient((EventLoopGroup *)local_188,(string *)local_138,&local_1a8)
    ;
    std::__cxx11::string::~string(local_1d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
    iVar2 = echo_client.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi._4_4_;
    _Var3 = std::__atomic_base::operator_cast_to_int((__atomic_base *)&finished_clients);
    if (iVar2 < _Var3) {
      peVar4 = std::__shared_ptr_access<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_188);
      Liby::Timestamp::Timestamp(&local_1e8,8,0);
      std::shared_ptr<Liby::TcpClient>::shared_ptr
                ((shared_ptr<Liby::TcpClient> *)&pBytes,(shared_ptr<Liby::TcpClient> *)local_188);
      std::function<void()>::function<main::__0,void>
                ((function<void()> *)&local_208,(anon_class_16_1_df24ad85 *)&pBytes);
      Liby::TimerMixin::runAfter(&peVar4->super_TimerMixin,&local_1e8,&local_208);
      std::function<void_()>::~function(&local_208);
      main::$_0::~__0((__0 *)&pBytes);
      local_220 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_80,
                             (long)echo_client.
                                   super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi._4_4_);
      peVar4 = std::__shared_ptr_access<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_188);
      local_288.buf = (vector<char,_std::allocator<char>_> *)local_50;
      local_288.pBytes = local_220;
      local_288.start = (Timestamp *)&stack0xfffffffffffffe90;
      local_288.active_clients = &finished_clients;
      local_288.conns =
           (vector<Liby::Connection_*,_std::allocator<Liby::Connection_*>_> *)
           &group.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
      local_288.finished_clients = (atomic_int *)&bytesPerClients;
      local_288.connected_clients = (atomic_int *)((long)&bytesPerClients + 4);
      local_288.bytesPerClients = buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_
      ;
      local_288.group = (EventLoopGroup *)local_138;
      std::function<void(std::shared_ptr<Liby::Connection>)>::function<main::__1,void>
                ((function<void(std::shared_ptr<Liby::Connection>)> *)&local_240,&local_288);
      Liby::TcpClient::onConnect(peVar4,&local_240);
      std::function<void_(std::shared_ptr<Liby::Connection>)>::~function(&local_240);
    }
    else {
      peVar4 = std::__shared_ptr_access<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_188);
      Liby::Timestamp::Timestamp(&local_298,1000,0);
      std::shared_ptr<Liby::TcpClient>::shared_ptr
                (&local_2c8.echo_client,(shared_ptr<Liby::TcpClient> *)local_188);
      std::function<void()>::function<main::__2,void>((function<void()> *)&local_2b8,&local_2c8);
      Liby::TimerMixin::runEvery(&peVar4->super_TimerMixin,&local_298,&local_2b8);
      std::function<void_()>::~function(&local_2b8);
      main::$_2::~__2((__2 *)&local_2c8);
    }
    std::shared_ptr<Liby::TcpClient>::~shared_ptr((shared_ptr<Liby::TcpClient> *)local_188);
  }
  local_310.bytesPerClients =
       (unsigned_long *)&buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
  local_310.finished_clients = (atomic_int *)&bytesPerClients;
  local_310.start = (Timestamp *)&stack0xfffffffffffffe90;
  local_310.concurrency = (int *)&connected_clients;
  local_310.msg_num = &concurrency;
  std::function<void()>::function<main::__3,void>((function<void()> *)&local_2e8,&local_310);
  Liby::ExitCaller::call(&local_2e8);
  std::function<void_()>::~function(&local_2e8);
  local_338.active_clients = &finished_clients;
  std::function<bool()>::function<main::__4,void>((function<bool()> *)&local_330,&local_338);
  Liby::EventLoopGroup::run((EventLoopGroup *)local_138,&local_330);
  std::function<bool_()>::~function(&local_330);
  argv_local._4_4_ = 0;
  Liby::EventLoopGroup::~EventLoopGroup((EventLoopGroup *)local_138);
  std::vector<Liby::Connection_*,_std::allocator<Liby::Connection_*>_>::~vector
            ((vector<Liby::Connection_*,_std::allocator<Liby::Connection_*>_> *)
             &group.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_80);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_50)
  ;
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
    //    Logger::setLevel(Logger::LogLevel::VERBOSE);
    int msg_num, msg_len, concurrency;
    atomic_int active_clients;
    atomic_int connected_clients(0);
    atomic_int finished_clients(0);
    if (argc == 7) {
        msg_num = ::atoi(argv[5]);
        msg_len = ::atoi(argv[6]);
        concurrency = ::atoi(argv[3]);
        active_clients = ::atoi(argv[4]);
    } else if (argc == 6) {
        msg_num = ::atoi(argv[4]);
        msg_len = ::atoi(argv[5]);
        active_clients = concurrency = ::atoi(argv[3]);
    } else {
        print_usage();
        return 1;
    }
    unsigned long bytesPerClients = msg_len * msg_num;

    vector<char> buf(msg_len, 'A');
    vector<unsigned long> bytes(concurrency, 0);
    vector<Connection *> conns;

    EventLoopGroup group(4, "EPOLL");
    auto start = Timestamp::now();
    for (int i = 0; i < concurrency; i++) {
        auto echo_client = group.creatTcpClient(argv[1], argv[2]);
        if (i < active_clients) {
            echo_client->runAfter(Timestamp(8, 0), [echo_client] {});
            unsigned long *pBytes = &bytes[i];
            echo_client->onConnect([&buf, pBytes, &start, &active_clients,
                                    &conns, &finished_clients,
                                    &connected_clients, bytesPerClients,
                                    &group](std::shared_ptr<Connection> conn) {
                if (!conn) {
                    return;
                }

                connected_clients++;
                conns.push_back(conn.get());
                if (connected_clients != active_clients) {
                    static int i = 0;
                    i++;
                    //                    info("%d", i);
                    conn->enableRead(false);
                } else {
                    start = Timestamp::now();
                    for (auto c : conns) {
                        c->runEventHandler([c, &buf] {
                            c->enableRead(true);
                            c->send(&buf[0], buf.size());
                        });
                    }
                }

                conn->onRead([&buf, pBytes, bytesPerClients, &active_clients,
                              &finished_clients, &group](Connection &c) {
                    *pBytes += c.read().size();
                    c.send(c.read());

                    info("herohahaha in loop %p",
                         EventLoop::curr_thread_loop());

                    if (*pBytes >= bytesPerClients) {
                        c.destroy();
                        group.robinLoop1(0)->runEventHandler(
                            [&active_clients, &finished_clients] {
                                finished_clients++;
                                if (--active_clients <= 0) {
                                    ::exit(0);
                                }
                            });
                    }
                });
                conn->onErro([&group, &active_clients](Connection &) {
                    group.robinLoop1(0)->runEventHandler([&active_clients] {
                        if (--active_clients <= 0) {
                            ::exit(0);
                        }
                    });
                });

                //                conn->send(&buf[0], buf.size());
            });
        } else {
            echo_client->runEvery(Timestamp(1000, 0), [echo_client] {});
        }
    }

    ExitCaller::call([&] {
        auto end = Timestamp::now();
        unsigned long totalBytes = bytesPerClients * finished_clients;
        info("总时间 %g 秒", (end - start).toSecF());
        info("totalBytes = %ld", totalBytes);
        info("速度 %lf MiB/s",
             totalBytes / (end - start).toSecF() / 1024 / 1024);
        info(" QPS %d", (int)(concurrency * msg_num / (end - start).toSecF()));
    });

    group.run([&active_clients] { return active_clients > 0; });

    return 0;
}